

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_map.h
# Opt level: O2

char * __thiscall cppcms::impl::string_pool::allocate_space(string_pool *this,size_t size)

{
  page *ppVar1;
  page *ppVar2;
  char *pcVar3;
  undefined8 *puVar4;
  ulong uVar5;
  
  if (this->page_size_ < size * 2) {
    ppVar2 = (page *)malloc(size + 0x10);
    if (ppVar2 == (page *)0x0) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = &std::cout;
      __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    ppVar1 = this->pages_;
    ppVar2->next = ppVar1->next;
    ppVar1->next = ppVar2;
    pcVar3 = ppVar2->data;
  }
  else {
    uVar5 = this->free_space_;
    if (uVar5 < size) {
      add_page(this);
      uVar5 = this->free_space_;
    }
    pcVar3 = this->data_;
    this->data_ = pcVar3 + size;
    this->free_space_ = uVar5 - size;
  }
  return pcVar3;
}

Assistant:

char *allocate_space(size_t size)
			{
				if(size * 2 > page_size_) {
					page *p=(page *)malloc(size + sizeof(page));
					if(!p)
						throw std::bad_alloc();
					p->next = pages_->next;
					pages_->next = p;
					return p->data;
				}
				if(size > free_space_) {
					add_page();
				}
				char *result = data_;
				data_+=size;
				free_space_ -= size;
				return result;
			}